

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof_lambda_auto.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int argc_local;
  tst_cpp14_argsof_lambda_auto tc;
  QCoreApplication app;
  
  argc_local = argc;
  QCoreApplication::QCoreApplication(&app,&argc_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_cpp14_argsof_lambda_auto::tst_cpp14_argsof_lambda_auto(&tc);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/cpp14/tst_argsof_lambda_auto.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O2/tests/auto/qtpromise/cpp14"
            );
  iVar1 = QTest::qExec(&tc.super_QObject,argc_local,argv);
  QObject::~QObject(&tc.super_QObject);
  QCoreApplication::~QCoreApplication(&app);
  return iVar1;
}

Assistant:

void tst_cpp14_argsof_lambda_auto::lambdaAutoArgs()
{
    auto lOneArg = [](auto) {};
    auto lManyArgs = [](const auto&, auto, auto) {};
    auto lMutable = [](const auto&, auto) mutable {};

    Q_STATIC_ASSERT((ArgsOf<decltype(lOneArg)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lManyArgs)>::count == 0));
    Q_STATIC_ASSERT((ArgsOf<decltype(lMutable)>::count == 0));
}